

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_280db::OverheadTest_PartialMaxBlocks_Test::~OverheadTest_PartialMaxBlocks_Test
          (OverheadTest_PartialMaxBlocks_Test *this)

{
  OverheadTest_PartialMaxBlocks_Test *this_local;
  
  ~OverheadTest_PartialMaxBlocks_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(OverheadTest, PartialMaxBlocks) {
  OverheadTest test(512, 4096);
  for (int i = 0; i < 10; i++) {
    test.Alloc(2096 + i);
  }
  if (!UPB_ASAN) {
    EXPECT_NEAR(test.WastePct(), 0.16, 0.025);
    EXPECT_NEAR(test.AmortizedAlloc(), 1.1, 0.25);
  }
}